

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  objectivec oVar1;
  string *src;
  long lVar2;
  Type TVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  LogMessage *other;
  EnumValueDescriptor *this_00;
  size_type *psVar6;
  char *pcVar7;
  EnumValueDescriptor *descriptor;
  char *pcVar8;
  protobuf *this_01;
  _Alloc_hider _Var9;
  string bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [56];
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (*(int *)(this + 0x3c) == 3) {
switchD_002603b5_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "nil";
    pcVar7 = "";
    goto LAB_0026034e;
  }
  this_01 = (protobuf *)this;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    this_01 = (protobuf *)local_d0;
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_f0._M_dataplus._M_p = (pointer)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)this_01,
               (FieldDescriptor **)&local_f0);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4)) {
  case 1:
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d0 + 0x10);
    local_d0._0_8_ = paVar5;
    local_d0._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x90),paVar5->_M_local_buf);
    local_d0._8_8_ = local_d0._8_8_ + -(long)paVar5;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (char *)(local_d0._8_8_ + local_d0._0_8_);
    pcVar8 = (char *)local_d0._0_8_;
    goto LAB_0026034e;
  case 2:
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d0 + 0x10);
    local_d0._0_8_ = paVar5;
    local_d0._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x90),paVar5->_M_local_buf);
    local_d0._8_8_ = local_d0._8_8_ + -(long)paVar5;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    break;
  case 3:
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d0 + 0x10);
    local_d0._0_8_ = paVar5;
    local_d0._8_8_ = FastUInt32ToBufferLeft(*(uint32 *)(this + 0x90),paVar5->_M_local_buf);
    local_d0._8_8_ = local_d0._8_8_ + -(long)paVar5;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    break;
  case 4:
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d0 + 0x10);
    local_d0._0_8_ = paVar5;
    local_d0._8_8_ = FastUInt64ToBufferLeft(*(uint64 *)(this + 0x90),paVar5->_M_local_buf);
    local_d0._8_8_ = local_d0._8_8_ + -(long)paVar5;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(&local_38,this_01,*(double *)(this + 0x90));
    HandleExtremeFloatingPoint(__return_storage_ptr__,&local_38,false);
    paVar5 = &local_38.field_2;
    goto LAB_00260641;
  case 6:
    SimpleFtoa_abi_cxx11_(&local_58,this_01,*(float *)(this + 0x90));
    HandleExtremeFloatingPoint(__return_storage_ptr__,&local_58,true);
    paVar5 = &local_58.field_2;
LAB_00260641:
    _Var9._M_p = *(pointer *)(paVar5->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar5) {
      return __return_storage_ptr__;
    }
    goto LAB_00260759;
  case 7:
    oVar1 = this[0x90];
    pcVar8 = "NO";
    if ((ulong)(byte)oVar1 != 0) {
      pcVar8 = "YES";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)(byte)oVar1 + 2;
LAB_0026034e:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
    return __return_storage_ptr__;
  case 8:
    this_00 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_00,descriptor);
    return __return_storage_ptr__;
  case 9:
    if ((this[0x40] != (objectivec)0x1) ||
       (src = *(string **)(this + 0x90), src->_M_string_length == 0)) goto switchD_002603b5_caseD_a;
    TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar3 != TYPE_BYTES) {
      CEscape(&local_98,src);
      EscapeTrigraphs(&local_f0,&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "@\"",&local_f0);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "\"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      paVar5 = &local_98.field_2;
      goto LAB_00260641;
    }
    local_d0._16_4_ = ghtonl((uint32)src->_M_string_length);
    local_d0._8_8_ = (char *)0x4;
    local_d0[0x14] = '\0';
    local_d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_d0 + 0x10);
    std::__cxx11::string::_M_append(local_d0,(ulong)(src->_M_dataplus)._M_p);
    CEscape(&local_78,(string *)local_d0);
    EscapeTrigraphs(&local_98,&local_78);
    std::operator+(&local_f0,"(NSData*)\"",&local_98);
    std::operator+(__return_storage_ptr__,&local_f0,"\"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    _Var9._M_p = (pointer)local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_00260759;
  case 10:
    goto switchD_002603b5_caseD_a;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
               ,0x35d);
    other = internal::LogMessage::operator<<((LogMessage *)local_d0,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  _Var9._M_p = local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_00260759:
    operator_delete(_Var9._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return StrCat(field->default_value_uint32()) + "U";
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return StrCat(field->default_value_int64()) + "LL";
    case FieldDescriptor::CPPTYPE_UINT64:
      return StrCat(field->default_value_uint64()) + "ULL";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      const string& default_string = field->default_value_string();
      if (!has_default_value || default_string.length() == 0) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32 length = ghtonl(default_string.length());
        string bytes((const char*)&length, sizeof(length));
        bytes.append(default_string);
        return "(NSData*)\"" + EscapeTrigraphs(CEscape(bytes)) + "\"";
      } else {
        return "@\"" + EscapeTrigraphs(CEscape(default_string)) + "\"";
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return string();
}